

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

ClipVec4 * __thiscall
rr::anon_unknown_19::cliputil::ComponentPlane<1,_2>::getLineIntersectionPoint
          (ClipVec4 *__return_storage_ptr__,ComponentPlane<1,_2> *this,ClipVec4 *v0,ClipVec4 *v1)

{
  double y;
  ClipFloat CVar1;
  double a;
  double a_00;
  ClipFloat complementClipRatio;
  ClipFloat clipRatio;
  undefined1 local_70 [8];
  ClipVec4 clippedV1;
  undefined1 local_48 [8];
  ClipVec4 clippedV0;
  ClipVec4 *v1_local;
  ClipVec4 *v0_local;
  ComponentPlane<1,_2> *this_local;
  
  clippedV0.m_data[3] = (double)v1;
  memset(clippedV1.m_data + 3,0,8);
  ComponentPlane((ComponentPlane<1,_2> *)(clippedV1.m_data + 3));
  CVar1 = clipLineSegmentEnd((ComponentPlane<1,_2> *)(clippedV1.m_data + 3),v0,
                             (ClipVec4 *)clippedV0.m_data[3]);
  tcu::mix<4>((Vector<double,_4> *)local_48,v0,v1,CVar1);
  y = clippedV0.m_data[3];
  memset(&clipRatio,0,8);
  ComponentPlane<-1,_2>::ComponentPlane((ComponentPlane<_1,_2> *)&clipRatio);
  CVar1 = ComponentPlane<-1,_2>::clipLineSegmentEnd
                    ((ComponentPlane<_1,_2> *)&clipRatio,v0,(ClipVec4 *)clippedV0.m_data[3]);
  tcu::mix<4>((Vector<double,_4> *)local_70,v0,(Vector<double,_4> *)y,CVar1);
  (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,local_48,local_70);
  if (0.5 < a) {
    (*(this->super_ClipVolumePlane)._vptr_ClipVolumePlane[1])(this,local_70,local_48);
    tcu::mix<4>(__return_storage_ptr__,(Vector<double,_4> *)local_70,(Vector<double,_4> *)local_48,
                a_00);
  }
  else {
    tcu::mix<4>(__return_storage_ptr__,(Vector<double,_4> *)local_48,(Vector<double,_4> *)local_70,a
               );
  }
  return __return_storage_ptr__;
}

Assistant:

ClipVec4 ComponentPlane<Sign, CompNdx>::getLineIntersectionPoint (const ClipVec4& v0, const ClipVec4& v1) const
{
	// A point on line might be far away, causing clipping ratio (clipLineSegmentEnd) to become extremely close to 1.0
	// even if the another point is not on the plane. Prevent clipping ratio from saturating by using points on line
	// that are (nearly) on this and (nearly) on the opposite plane.

	const ClipVec4	clippedV0	= tcu::mix(v0, v1, ComponentPlane<+1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipVec4	clippedV1	= tcu::mix(v0, v1, ComponentPlane<-1, CompNdx>().clipLineSegmentEnd(v0, v1));
	const ClipFloat	clipRatio	= clipLineSegmentEnd(clippedV0, clippedV1);

	// Find intersection point of line from v0 to v1 and the current plane. Avoid ratios near 1.0
	if (clipRatio <= (ClipFloat)0.5)
		return tcu::mix(clippedV0, clippedV1, clipRatio);
	else
	{
		const ClipFloat complementClipRatio = clipLineSegmentEnd(clippedV1, clippedV0);
		return tcu::mix(clippedV1, clippedV0, complementClipRatio);
	}
}